

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_AddTxIn_RemoveTxIn_Test::TestBody(Transaction_AddTxIn_RemoveTxIn_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Transaction tx;
  Script script;
  string local_1f0;
  AssertHelper local_1d0;
  string local_1c8;
  Transaction local_1a8;
  Script local_168;
  AbstractTxInReference local_130;
  AbstractTxInReference local_a0;
  
  cfd::core::Transaction::Transaction(&local_1a8,2,0);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"1600141c673dd706e05b17e5c9ff033c8619d06098d7ac","");
  cfd::core::Script::Script(&local_168,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,
                 "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9","");
      cfd::core::Txid::Txid((Txid *)&local_1f0,&local_1c8);
      cfd::core::Transaction::AddTxIn(&local_1a8,(Txid *)&local_1f0,1,0xfffffffe,&local_168);
      local_1f0._M_dataplus._M_p = (pointer)&PTR__Txid_0068dcd8;
      if ((undefined8 *)local_1f0._M_string_length != (undefined8 *)0x0) {
        operator_delete((void *)local_1f0._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x10e,
               "Expected: tx.AddTxIn( Txid( \"306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9\"), 1, 4294967294, script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_1f0._M_dataplus._M_p + 8))();
      }
      local_1f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  uVar2 = cfd::core::Transaction::GetTxInCount(&local_1a8);
  local_1c8._M_dataplus._M_p._0_4_ = uVar2;
  local_1d0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1f0,"tx.GetTxInCount()","1",(uint *)&local_1c8,(int *)&local_1d0);
  if ((char)local_1f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if ((undefined8 *)local_1f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_1f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x10f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
      }
      local_1c8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxIn((TxInReference *)&local_a0,&local_1a8,0);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_a0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x110,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_1f0._M_dataplus._M_p + 8))();
      }
      local_1f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxIn(&local_1a8,0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x112,
               "Expected: tx.RemoveTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_1f0._M_dataplus._M_p + 8))();
      }
      local_1f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  uVar2 = cfd::core::Transaction::GetTxInCount(&local_1a8);
  local_1c8._M_dataplus._M_p._0_4_ = uVar2;
  local_1d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1f0,"tx.GetTxInCount()","0",(uint *)&local_1c8,(int *)&local_1d0);
  if ((char)local_1f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if ((undefined8 *)local_1f0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_1f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
      }
      local_1c8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_130,&local_1a8,0);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_130);
  }
  testing::Message::Message((Message *)&local_1f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x114,
             "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)&local_1f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_1f0._M_dataplus._M_p + 8))();
    }
    local_1f0._M_dataplus._M_p = (pointer)0x0;
  }
  cfd::core::Script::~Script(&local_168);
  cfd::core::Transaction::~Transaction(&local_1a8);
  return;
}

Assistant:

TEST(Transaction, AddTxIn_RemoveTxIn) {
  Transaction tx(exp_version, exp_locktime);

  Script script("1600141c673dd706e05b17e5c9ff033c8619d06098d7ac");
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9"),
          1, 4294967294, script));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  EXPECT_NO_THROW(tx.GetTxIn(0));

  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  EXPECT_EQ(tx.GetTxInCount(), 0);
  EXPECT_THROW(tx.GetTxIn(0), CfdException);
}